

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d57_q2_heap_order2.cpp
# Opt level: O1

void __thiscall
CP::priority_queue<student,_std::less<student>_>::fixDown
          (priority_queue<student,_std::less<student>_> *this,size_t idx)

{
  ulong uVar1;
  pointer pcVar2;
  student *psVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  student *psVar7;
  student tmp;
  student local_68;
  
  local_68.name._M_dataplus._M_p = (pointer)&local_68.name.field_2;
  psVar3 = this->mData + idx;
  pcVar2 = (psVar3->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + (psVar3->name)._M_string_length);
  std::vector<int,_std::allocator<int>_>::vector(&local_68.scores,&psVar3->scores);
  while( true ) {
    uVar1 = idx * 2 + 1;
    if (this->mSize <= uVar1) break;
    uVar6 = idx * 2 + 2;
    uVar5 = uVar1;
    if ((uVar6 < this->mSize) &&
       (bVar4 = student::operator<(this->mData + uVar1,this->mData + uVar6), uVar5 = uVar6, !bVar4))
    {
      uVar5 = uVar1;
    }
    bVar4 = student::operator<(this->mData + uVar5,&local_68);
    if (bVar4) break;
    psVar3 = this->mData;
    psVar7 = psVar3 + idx;
    std::__cxx11::string::_M_assign((string *)psVar7);
    std::vector<int,_std::allocator<int>_>::operator=(&psVar7->scores,&psVar3[uVar5].scores);
    idx = uVar5;
  }
  psVar3 = this->mData;
  std::__cxx11::string::_M_assign((string *)(psVar3 + idx));
  std::vector<int,_std::allocator<int>_>::operator=(&psVar3[idx].scores,&local_68.scores);
  if (local_68.scores.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.scores.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.scores.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.scores.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != &local_68.name.field_2) {
    operator_delete(local_68.name._M_dataplus._M_p,local_68.name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void fixDown(size_t idx) {
      T tmp = mData[idx];
      size_t c;
      while ((c = 2 * idx + 1) < mSize) {
        if (c + 1 < mSize && mLess(mData[c],mData[c + 1]) ) c++;
        if ( mLess(mData[c],tmp) ) break;
        mData[idx] = mData[c];
        idx = c;
      }
      mData[idx] = tmp;
    }